

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O2

void __thiscall jsonChildren::inc(jsonChildren *this)

{
  json_index_t jVar1;
  JSONNode **ppJVar2;
  allocator local_31;
  json_string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Children is null inc",&local_31);
  JSONDebug::_JSON_ASSERT(true,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  jVar1 = this->mysize;
  if (jVar1 == this->mycapacity) {
    if (jVar1 == 0) {
      ppJVar2 = this->array;
      std::__cxx11::string::string
                ((string *)&local_30,"Expanding a 0 capacity array, but not null",&local_31);
      JSONDebug::_JSON_ASSERT(ppJVar2 == (JSONNode **)0x0,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      ppJVar2 = json_malloc<JSONNode*>(8);
      this->array = ppJVar2;
      this->mycapacity = 8;
    }
    else {
      this->mycapacity = jVar1 * 2;
      ppJVar2 = json_realloc<JSONNode*>(this->array,(ulong)(jVar1 * 2));
      this->array = ppJVar2;
    }
  }
  return;
}

Assistant:

void jsonChildren::inc(void) json_nothrow {
    JSON_ASSERT(this != 0, JSON_TEXT("Children is null inc"));
    if (json_unlikely(mysize == mycapacity)){  //it's full
	   if (json_unlikely(mycapacity == 0)){  //the array hasn't been created yet
		  JSON_ASSERT(!array, JSON_TEXT("Expanding a 0 capacity array, but not null"));
		  #ifdef JSON_LESS_MEMORY
			 array = json_malloc<JSONNode*>(1);
			 mycapacity = 1;
		  #else
			 array = json_malloc<JSONNode*>(8);  //8 seems average for JSON, and it's only 64 bytes
			 mycapacity = 8;
		  #endif
	   } else {
		  #ifdef JSON_LESS_MEMORY
			 mycapacity += 1;  //increment the size of the array
		  #else
			 mycapacity <<= 1;  //double the size of the array
		  #endif
		  array = json_realloc<JSONNode*>(array, mycapacity);
	   }
    }
}